

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  long *plVar1;
  size_type *psVar2;
  size_t sVar3;
  IStreamingReporter *pIVar4;
  pointer pcVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  SectionTracker *pSVar10;
  undefined4 extraout_var;
  size_t sVar11;
  ulong uVar12;
  size_t sVar13;
  size_t sVar14;
  string redirectedCerr;
  string redirectedCout;
  string local_1b8;
  string local_198;
  size_t local_178;
  size_t sStack_170;
  TestCaseStats local_160;
  
  sVar3 = (this->m_totals).assertions.passed;
  sVar14 = (this->m_totals).assertions.failed;
  sVar11 = (this->m_totals).assertions.failedButOk;
  local_178 = (this->m_totals).testCases.passed;
  sStack_170 = (this->m_totals).testCases.failed;
  sVar13 = (this->m_totals).testCases.failedButOk;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  local_198._M_string_length = 0;
  local_198.field_2._M_local_buf[0] = '\0';
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  pIVar4 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar4->_vptr_IStreamingReporter[7])(pIVar4,testCase);
  this->m_activeTestCase = testCase;
  pSVar10 = (SectionTracker *)TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
  iVar9 = (*(pSVar10->super_TrackerBase).super_ITracker._vptr_ITracker[0xe])(pSVar10);
  if ((char)iVar9 == '\0') {
    __assert_fail("rootTracker.isSectionTracker()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ricab[P]scope_guard/build_O3/_deps/catch2-src/single_include/catch2/catch.hpp"
                  ,0x31c9,"Totals Catch::RunContext::runTest(const TestCase &)");
  }
  iVar9 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[0x13])();
  TestCaseTracking::SectionTracker::addInitialFilters
            (pSVar10,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var,iVar9));
  psVar2 = &local_160.testInfo.name._M_string_length;
  do {
    (this->m_trackerContext).m_currentTracker =
         (this->m_trackerContext).m_rootTracker.
         super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->m_trackerContext).m_runState = Executing;
    pcVar5 = (testCase->super_TestCaseInfo).name._M_dataplus._M_p;
    local_160._vptr_TestCaseStats = (_func_int **)psVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_160,pcVar5,
               pcVar5 + (testCase->super_TestCaseInfo).name._M_string_length);
    local_160.testInfo.name.field_2._8_8_ = (testCase->super_TestCaseInfo).lineInfo.file;
    local_160.testInfo.className._M_dataplus._M_p =
         (pointer)(testCase->super_TestCaseInfo).lineInfo.line;
    pSVar10 = TestCaseTracking::SectionTracker::acquire
                        (&this->m_trackerContext,(NameAndLocation *)&local_160);
    this->m_testCaseTracker = (ITracker *)pSVar10;
    if (local_160._vptr_TestCaseStats != (_func_int **)psVar2) {
      operator_delete(local_160._vptr_TestCaseStats);
    }
    runCurrentTest(this,&local_198,&local_1b8);
    iVar9 = (*this->m_testCaseTracker->_vptr_ITracker[3])();
    if ((char)iVar9 != '\0') break;
    uVar6 = (this->m_totals).assertions.failed;
    iVar9 = (*(((this->m_config).
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[9])();
  } while (uVar6 < (ulong)(long)iVar9);
  __return_storage_ptr__->error = 0;
  uVar6 = (this->m_totals).assertions.failed;
  sVar11 = (this->m_totals).assertions.failedButOk - sVar11;
  sVar14 = uVar6 - sVar14;
  (__return_storage_ptr__->assertions).passed = (this->m_totals).assertions.passed - sVar3;
  (__return_storage_ptr__->assertions).failed = sVar14;
  (__return_storage_ptr__->assertions).failedButOk = sVar11;
  sVar3 = (this->m_totals).testCases.failedButOk;
  uVar12 = 0x28;
  if (sVar14 == 0) {
    uVar12 = (ulong)(sVar11 != 0) << 4 | 0x20;
  }
  sVar7 = (this->m_totals).testCases.passed;
  sVar8 = (this->m_totals).testCases.failed;
  (__return_storage_ptr__->testCases).passed = sVar7 - local_178;
  (__return_storage_ptr__->testCases).failed = sVar8 - sStack_170;
  (__return_storage_ptr__->testCases).failedButOk = sVar3 - sVar13;
  plVar1 = (long *)((long)&__return_storage_ptr__->error + uVar12);
  *plVar1 = *plVar1 + 1;
  sVar11 = (__return_storage_ptr__->testCases).passed;
  sVar13 = (__return_storage_ptr__->testCases).failed;
  if ((sVar11 != 0 & (byte)(char)(testCase->super_TestCaseInfo).properties >> 2) == 1) {
    (__return_storage_ptr__->assertions).failed = sVar14 + 1;
    sVar11 = sVar11 - 1;
    (__return_storage_ptr__->testCases).passed = sVar11;
    sVar13 = sVar13 + 1;
    (__return_storage_ptr__->testCases).failed = sVar13;
  }
  (this->m_totals).testCases.passed = sVar7 + sVar11;
  (this->m_totals).testCases.failed = sVar8 + sVar13;
  (this->m_totals).testCases.failedButOk = sVar3 + (__return_storage_ptr__->testCases).failedButOk;
  pIVar4 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  iVar9 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[9])();
  TestCaseStats::TestCaseStats
            (&local_160,&testCase->super_TestCaseInfo,__return_storage_ptr__,&local_198,&local_1b8,
             (ulong)(long)iVar9 <= uVar6);
  (*pIVar4->_vptr_IStreamingReporter[0xc])(pIVar4,&local_160);
  TestCaseStats::~TestCaseStats(&local_160);
  this->m_activeTestCase = (TestCase *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Totals RunContext::runTest(TestCase const& testCase) {
        Totals prevTotals = m_totals;

        std::string redirectedCout;
        std::string redirectedCerr;

        auto const& testInfo = testCase.getTestCaseInfo();

        m_reporter->testCaseStarting(testInfo);

        m_activeTestCase = &testCase;

        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(testInfo.name, testInfo.lineInfo));
            runCurrentTest(redirectedCout, redirectedCerr);
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  redirectedCout,
                                  redirectedCerr,
                                  aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }